

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Misc.h
# Opt level: O1

void Logger::printError<std::__cxx11::wstring,unsigned_short>
               (ErrorType type,wchar_t *text,
               basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *args,
               unsigned_short *args_1)

{
  wstring message;
  wstring local_30;
  
  formatString<std::__cxx11::wstring,unsigned_short>(&local_30,text,args,args_1);
  printError(type,&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return;
}

Assistant:

static void printError(ErrorType type, const wchar_t* text, const Args&... args)
	{
		std::wstring message = formatString(text,args...);
		printError(type,message);
	}